

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

int64_t absl::base_internal::ReadMonotonicClockNanos(void)

{
  int *piVar1;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30 [2];
  char *local_28;
  char *absl_raw_log_internal_filename;
  undefined1 auStack_18 [4];
  int rc;
  timespec t;
  
  absl_raw_log_internal_filename._4_4_ = clock_gettime(4,(timespec *)auStack_18);
  if (absl_raw_log_internal_filename._4_4_ != 0) {
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/base/internal/sysinfo.cc"
    ;
    local_30[1] = 3;
    local_30[0] = 0xf8;
    piVar1 = __errno_location();
    std::__cxx11::to_string(&local_90,*piVar1);
    std::operator+(&local_70,"clock_gettime() failed: (",&local_90);
    std::operator+(&local_50,&local_70,")");
    AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
              ((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_30 + 1),
               &local_28,local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/base/internal/sysinfo.cc"
                  ,0xf8,"int64_t absl::base_internal::ReadMonotonicClockNanos()");
  }
  return _auStack_18 * 1000000000 + t.tv_sec;
}

Assistant:

static int64_t ReadMonotonicClockNanos() {
  struct timespec t;
#ifdef CLOCK_MONOTONIC_RAW
  int rc = clock_gettime(CLOCK_MONOTONIC_RAW, &t);
#else
  int rc = clock_gettime(CLOCK_MONOTONIC, &t);
#endif
  if (rc != 0) {
    ABSL_INTERNAL_LOG(
        FATAL, "clock_gettime() failed: (" + std::to_string(errno) + ")");
  }
  return int64_t{t.tv_sec} * 1000000000 + t.tv_nsec;
}